

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

const_iterator __thiscall
VulkanHppGenerator::findStructMemberItByType
          (VulkanHppGenerator *this,string *type,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *memberData)

{
  MemberData *pMVar1;
  __type_conflict _Var2;
  MemberData *pMVar3;
  
  pMVar3 = (memberData->
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (memberData->
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pMVar3 == pMVar1) {
      return (const_iterator)pMVar3;
    }
    _Var2 = std::operator==(&(pMVar3->type).type,type);
    if (_Var2) break;
    pMVar3 = pMVar3 + 1;
  }
  return (const_iterator)pMVar3;
}

Assistant:

std::vector<VulkanHppGenerator::MemberData>::const_iterator VulkanHppGenerator::findStructMemberItByType( std::string const &             type,
                                                                                                          std::vector<MemberData> const & memberData ) const
{
  return std::ranges::find_if( memberData, [&type]( MemberData const & md ) { return md.type.type == type; } );
}